

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arrays.h
# Opt level: O2

void __thiscall glslang::TSmallArrayVector::pop_front(TSmallArrayVector *this)

{
  TVector<glslang::TArraySize> *pTVar1;
  pointer __dest;
  long lVar2;
  pointer pTVar3;
  pointer __src;
  
  pTVar1 = this->sizes;
  if (pTVar1 != (TVector<glslang::TArraySize> *)0x0) {
    __dest = (pTVar1->
             super_vector<glslang::TArraySize,_glslang::pool_allocator<glslang::TArraySize>_>).
             super__Vector_base<glslang::TArraySize,_glslang::pool_allocator<glslang::TArraySize>_>.
             _M_impl.super__Vector_impl_data._M_start;
    lVar2 = (long)(pTVar1->
                  super_vector<glslang::TArraySize,_glslang::pool_allocator<glslang::TArraySize>_>).
                  super__Vector_base<glslang::TArraySize,_glslang::pool_allocator<glslang::TArraySize>_>
                  ._M_impl.super__Vector_impl_data._M_finish - (long)__dest >> 4;
    if (lVar2 == 1) {
      this->sizes = (TVector<glslang::TArraySize> *)0x0;
      return;
    }
    if (lVar2 != 0) {
      __src = __dest + 1;
      pTVar3 = (pTVar1->
               super_vector<glslang::TArraySize,_glslang::pool_allocator<glslang::TArraySize>_>).
               super__Vector_base<glslang::TArraySize,_glslang::pool_allocator<glslang::TArraySize>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      if (__src != pTVar3) {
        memmove(__dest,__src,(long)pTVar3 - (long)__src);
        pTVar3 = (pTVar1->
                 super_vector<glslang::TArraySize,_glslang::pool_allocator<glslang::TArraySize>_>).
                 super__Vector_base<glslang::TArraySize,_glslang::pool_allocator<glslang::TArraySize>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
      }
      (pTVar1->super_vector<glslang::TArraySize,_glslang::pool_allocator<glslang::TArraySize>_>).
      super__Vector_base<glslang::TArraySize,_glslang::pool_allocator<glslang::TArraySize>_>._M_impl
      .super__Vector_impl_data._M_finish = pTVar3 + -1;
      return;
    }
  }
  __assert_fail("sizes != nullptr && sizes->size() > 0",
                "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/glslang/MachineIndependent/../Include/arrays.h"
                ,0x8f,"void glslang::TSmallArrayVector::pop_front()");
}

Assistant:

void pop_front()
    {
        assert(sizes != nullptr && sizes->size() > 0);
        if (sizes->size() == 1)
            dealloc();
        else
            sizes->erase(sizes->begin());
    }